

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

void ncnn::resize_bilinear_image(Mat *src,Mat *dst,int w,int h)

{
  long lVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  void *pvVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  void *pvVar10;
  long lVar11;
  void *pvVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  void *pvVar16;
  long lVar17;
  ulong uVar18;
  ulong uVar19;
  undefined8 *puVar20;
  bool bVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  Mat rowsbuf0;
  Mat rowsbuf1;
  
  iVar9 = src->w;
  iVar4 = src->h;
  uVar7 = h * 3 + w * 3;
  uVar15 = 0xffffffffffffffff;
  if (-1 < (int)uVar7) {
    uVar15 = (ulong)uVar7 * 4;
  }
  pvVar10 = operator_new__(uVar15);
  lVar11 = (long)w;
  uVar15 = 0;
  if (0 < w) {
    uVar15 = (ulong)(uint)w;
  }
  lVar1 = (long)h * 4 + lVar11 * 4;
  for (uVar19 = 0; uVar15 != uVar19; uVar19 = uVar19 + 1) {
    fVar23 = ((float)(int)uVar19 + 0.5) * (float)iVar9 * (1.0 / (float)w) + -0.5;
    fVar22 = floorf(fVar23);
    iVar8 = (int)fVar22;
    fVar24 = 0.0;
    bVar21 = -1 < iVar8;
    if (iVar8 < 1) {
      iVar8 = 0;
    }
    if (bVar21) {
      fVar24 = fVar23 - (float)(int)fVar22;
    }
    if (iVar9 + -1 <= iVar8) {
      fVar24 = 1.0;
      iVar8 = iVar9 + -2;
    }
    *(int *)((long)pvVar10 + uVar19 * 4) = iVar8;
    *(float *)((long)pvVar10 + uVar19 * 8 + lVar1) = 1.0 - fVar24;
    *(float *)((long)pvVar10 + uVar19 * 8 + lVar1 + 4) = fVar24;
  }
  puVar20 = (undefined8 *)((long)pvVar10 + (long)(w * 2) * 4 + (long)h * 4 + lVar11 * 4);
  uVar19 = (ulong)(uint)h;
  if (h < 1) {
    uVar19 = 0;
  }
  lVar17 = lVar1 + (long)(w * 2) * 4;
  for (uVar18 = 0; uVar19 != uVar18; uVar18 = uVar18 + 1) {
    fVar23 = ((float)(int)uVar18 + 0.5) * (float)iVar4 * (1.0 / (float)h) + -0.5;
    fVar22 = floorf(fVar23);
    iVar9 = (int)fVar22;
    fVar24 = 0.0;
    bVar21 = -1 < iVar9;
    if (iVar9 < 1) {
      iVar9 = 0;
    }
    if (bVar21) {
      fVar24 = fVar23 - (float)(int)fVar22;
    }
    if (iVar4 + -1 <= iVar9) {
      fVar24 = 1.0;
      iVar9 = iVar4 + -2;
    }
    *(int *)((long)pvVar10 + uVar18 * 4 + lVar11 * 4) = iVar9;
    *(float *)((long)pvVar10 + uVar18 * 8 + lVar17) = 1.0 - fVar24;
    *(float *)((long)pvVar10 + uVar18 * 8 + lVar17 + 4) = fVar24;
  }
  Mat::Mat(&rowsbuf0,w + 1,4,(Allocator *)0x0);
  Mat::Mat(&rowsbuf1,w + 1,4,(Allocator *)0x0);
  pvVar6 = src->data;
  iVar9 = src->w;
  pvVar16 = dst->data;
  iVar4 = dst->w;
  iVar8 = -1;
  for (uVar18 = 0; uVar18 != uVar19; uVar18 = uVar18 + 1) {
    iVar5 = *(int *)((long)pvVar10 + uVar18 * 4 + lVar11 * 4);
    if (iVar5 == iVar8) {
      for (uVar13 = 0; pvVar12 = rowsbuf1.data, pvVar14 = rowsbuf0.data, uVar15 != uVar13;
          uVar13 = uVar13 + 1) {
        uVar2 = *(undefined8 *)((long)pvVar10 + uVar13 * 8 + lVar1);
        uVar3 = *(undefined8 *)
                 ((long)pvVar6 +
                 (long)*(int *)((long)pvVar10 + uVar13 * 4) * 4 + (long)((iVar8 + 1) * iVar9) * 4);
        *(float *)((long)rowsbuf0.data + uVar13 * 4) =
             (float)((ulong)uVar3 >> 0x20) * (float)((ulong)uVar2 >> 0x20) +
             (float)uVar3 * (float)uVar2;
      }
    }
    else {
      for (uVar13 = 0; pvVar12 = rowsbuf0.data, pvVar14 = rowsbuf1.data, uVar15 != uVar13;
          uVar13 = uVar13 + 1) {
        lVar17 = (long)*(int *)((long)pvVar10 + uVar13 * 4);
        uVar2 = *(undefined8 *)((long)pvVar10 + uVar13 * 8 + lVar1);
        uVar3 = *(undefined8 *)((long)pvVar6 + lVar17 * 4 + (long)(iVar9 * iVar5) * 4);
        fVar23 = (float)uVar2;
        fVar22 = (float)((ulong)uVar2 >> 0x20);
        *(float *)((long)rowsbuf0.data + uVar13 * 4) =
             (float)((ulong)uVar3 >> 0x20) * fVar22 + (float)uVar3 * fVar23;
        uVar2 = *(undefined8 *)((long)pvVar6 + lVar17 * 4 + (long)((iVar5 + 1) * iVar9) * 4);
        *(float *)((long)rowsbuf1.data + uVar13 * 4) =
             (float)((ulong)uVar2 >> 0x20) * fVar22 + (float)uVar2 * fVar23;
      }
    }
    uVar2 = *puVar20;
    for (lVar17 = 0; w != (int)lVar17; lVar17 = lVar17 + 1) {
      *(float *)((long)pvVar16 + lVar17 * 4) =
           *(float *)((long)pvVar14 + lVar17 * 4) * (float)((ulong)uVar2 >> 0x20) +
           *(float *)((long)pvVar12 + lVar17 * 4) * (float)uVar2;
    }
    iVar8 = iVar5 + 1;
    puVar20 = puVar20 + 1;
    pvVar16 = (void *)((long)pvVar16 + (long)iVar4 * 4);
    rowsbuf0.data = pvVar12;
    rowsbuf1.data = pvVar14;
  }
  operator_delete__(pvVar10);
  Mat::~Mat(&rowsbuf1);
  Mat::~Mat(&rowsbuf0);
  return;
}

Assistant:

static void resize_bilinear_image(const Mat& src, Mat& dst, int w, int h)
{
    double scale_x = (double)src.w / w;
    double scale_y = (double)src.h / h;

    int* buf = new int[w + h + w*2 + h*2];

    int* xofs = buf;//new int[w];
    int* yofs = buf + w;//new int[h];

    float* alpha = (float*)(buf + w + h);//new float[w * 2];
    float* beta = (float*)(buf + w + h + w*2);//new float[h * 2];

    float fx;
    float fy;
    int sx;
    int sy;

    for (int dx = 0; dx < w; dx++)
    {
        fx = (float)((dx + 0.5) * scale_x - 0.5);
        sx = floor(fx);
        fx -= sx;

        if (sx < 0)
        {
            sx = 0;
            fx = 0.f;
        }
        if (sx >= src.w - 1)
        {
            sx = src.w - 2;
            fx = 1.f;
        }

        xofs[dx] = sx;

        alpha[dx*2    ] = 1.f - fx;
        alpha[dx*2 + 1] = fx;
    }

    for (int dy = 0; dy < h; dy++)
    {
        fy = (float)((dy + 0.5) * scale_y - 0.5);
        sy = floor(fy);
        fy -= sy;

        if (sy < 0)
        {
            sy = 0;
            fy = 0.f;
        }
        if (sy >= src.h - 1)
        {
            sy = src.h - 2;
            fy = 1.f;
        }

        yofs[dy] = sy;

        beta[dy*2    ] = 1.f - fy;
        beta[dy*2 + 1] = fy;
    }

    // loop body
    Mat rowsbuf0(w + 1);
    Mat rowsbuf1(w + 1);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;

    int prev_sy1 = -1;

    for (int dy = 0; dy < h; dy++ )
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows0_old;
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S1p = S1 + sx;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }
        else
        {
            // hresize two rows
            const float* S0 = src.row(sy);
            const float* S1 = src.row(sy+1);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            int dx = 0;
#if __ARM_NEON
            for ( ; dx+1 < w; dx += 2 )
            {
                int sx = xofs[dx];
                int sxn = xofs[dx+1];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S0np = S0 + sxn;
                const float* S1np = S1 + sxn;

                float32x4_t _a = vld1q_f32(alphap);
                float32x2_t _S0 = vld1_f32(S0p);
                float32x2_t _S1 = vld1_f32(S1p);
                float32x2_t _S0n = vld1_f32(S0np);
                float32x2_t _S1n = vld1_f32(S1np);

                float32x4_t _S0S0n = vcombine_f32(_S0, _S0n);
                float32x4_t _S1S1n = vcombine_f32(_S1, _S1n);
                float32x4_t _ms0 = vmulq_f32(_S0S0n, _a);
                float32x4_t _ms1 = vmulq_f32(_S1S1n, _a);
                float32x2_t _rows0 = vpadd_f32(vget_low_f32(_ms0), vget_high_f32(_ms0));
                float32x2_t _rows1 = vpadd_f32(vget_low_f32(_ms1), vget_high_f32(_ms1));

                vst1_f32(rows0p + dx, _rows0);
                vst1_f32(rows1p + dx, _rows1);

                alphap += 4;
            }
#endif // __ARM_NEON
            for ( ; dx < w; dx++ )
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                rows0p[dx] = S0p[0]*a0 + S0p[1]*a1;
                rows1p[dx] = S1p[0]*a0 + S1p[1]*a1;

                alphap += 2;
            }
        }

        prev_sy1 = sy + 1;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* Dp = dst.row(dy);

#if __ARM_NEON
        int nn = w >> 3;
#else
        int nn = 0;
#endif
        int remain = w - (nn << 3);

#if __ARM_NEON
        float32x4_t _b0 = vdupq_n_f32(b0);
        float32x4_t _b1 = vdupq_n_f32(b1);
        for (; nn>0; nn--)
        {
            float32x4_t _rows0 = vld1q_f32(rows0p);
            float32x4_t _rows1 = vld1q_f32(rows1p);

            float32x4_t _D = vmulq_f32(_rows0, _b0);
            _D = vmlaq_f32(_D, _rows1, _b1);

            vst1q_f32(Dp, _D);

            float32x4_t _rows0n = vld1q_f32(rows0p+4);
            float32x4_t _rows1n = vld1q_f32(rows1p+4);

            float32x4_t _Dn = vmulq_f32(_rows0n, _b0);
            _Dn = vmlaq_f32(_Dn, _rows1n, _b1);

            vst1q_f32(Dp+4, _Dn);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
        }
#endif // __ARM_NEON
        for ( ; remain; --remain )
        {
//             D[x] = rows0[x]*b0 + rows1[x]*b1;
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1;
        }

        beta += 2;
    }

    delete[] buf;
}